

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

_Bool player_stat_dec(player *p,wchar_t stat,_Bool permanent)

{
  bool bVar1;
  int local_20;
  wchar_t res;
  wchar_t max;
  wchar_t cur;
  _Bool permanent_local;
  wchar_t stat_local;
  player *p_local;
  
  res = (wchar_t)p->stat_cur[stat];
  local_20 = (int)p->stat_max[stat];
  if (res < L'\x1d') {
    if (res < L'\x13') {
      if (L'\x03' < res) {
        res = res + L'\xffffffff';
      }
    }
    else {
      res = L'\x12';
    }
  }
  else {
    res = res + L'\xfffffff6';
  }
  bVar1 = res != p->stat_cur[stat];
  if (permanent) {
    if (local_20 < 0x1d) {
      if (local_20 < 0x13) {
        if (3 < local_20) {
          local_20 = local_20 + -1;
        }
      }
      else {
        local_20 = 0x12;
      }
    }
    else {
      local_20 = local_20 + -10;
    }
    bVar1 = local_20 != p->stat_max[stat];
  }
  if (bVar1) {
    p->stat_cur[stat] = (int16_t)res;
    p->stat_max[stat] = (int16_t)local_20;
    p->upkeep->update = p->upkeep->update | 1;
    p->upkeep->redraw = p->upkeep->redraw | 0x10;
  }
  return bVar1;
}

Assistant:

bool player_stat_dec(struct player *p, int stat, bool permanent)
{
	int cur, max, res = false;

	cur = p->stat_cur[stat];
	max = p->stat_max[stat];

	if (cur > 18+10)
		cur -= 10;
	else if (cur > 18)
		cur = 18;
	else if (cur > 3)
		cur -= 1;

	res = (cur != p->stat_cur[stat]);

	if (permanent) {
		if (max > 18+10)
			max -= 10;
		else if (max > 18)
			max = 18;
		else if (max > 3)
			max -= 1;

		res = (max != p->stat_max[stat]);
	}

	if (res) {
		p->stat_cur[stat] = cur;
		p->stat_max[stat] = max;
		p->upkeep->update |= (PU_BONUS);
		p->upkeep->redraw |= (PR_STATS);
	}

	return res;
}